

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O0

TransactionController *
cfd::api::TransactionApiBase::AddSign<cfd::TransactionController>
          (function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *create_controller,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  bool bVar1;
  ulong uVar2;
  string *message;
  reference this;
  TransactionController *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  TransactionController *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  byte in_stack_00000008;
  byte in_stack_00000010;
  SignParameter *sign_param_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range4_1;
  ScriptElement *element;
  iterator __end4;
  iterator __begin4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range4;
  ScriptBuilder builder;
  Script script;
  ScriptOperator op_code;
  SignParameter *sign_param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range2;
  bool has_op_code;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> sign_stack;
  TransactionController *txc;
  AbstractTxInReference *in_stack_fffffffffffffca8;
  TransactionController *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbc;
  undefined1 in_stack_fffffffffffffcbd;
  undefined1 in_stack_fffffffffffffcbe;
  undefined1 in_stack_fffffffffffffcbf;
  TransactionController *in_stack_fffffffffffffcc0;
  TransactionController *in_stack_fffffffffffffcc8;
  allocator *paVar3;
  Script local_308;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd44;
  Txid *in_stack_fffffffffffffd48;
  TransactionController *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd68;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_278;
  undefined8 local_270;
  reference local_268;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_260;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_258;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_250;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_238;
  ScriptBuilder local_230 [4];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe64;
  Txid *in_stack_fffffffffffffe68;
  TransactionController *in_stack_fffffffffffffe70;
  Script local_180;
  Script local_148;
  value_type local_110;
  ScriptOperator local_f8;
  reference local_c8;
  SignParameter *local_c0;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_b8;
  undefined8 local_b0;
  byte local_a1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_a0;
  byte local_86;
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  byte local_32;
  byte local_31;
  undefined8 local_30;
  undefined4 local_24;
  TransactionController *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_31 = in_stack_00000008 & 1;
  local_32 = in_stack_00000010 & 1;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfdapi_transaction_base.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0xdf;
    local_50.funcname = "AddSign";
    core::logger::warn<std::__cxx11::string_const&>
              (&local_50,"Failed to AddSign. Invalid hex string. empty data. tx=[{}]",local_18);
    local_85 = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Invalid hex string. empty data.",paVar3);
    core::CfdException::CfdException
              ((CfdException *)in_RCX,(CfdError)((ulong)paVar3 >> 0x20),message);
    local_85 = 0;
    __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_86 = 0;
  std::
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffffcc8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcc0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_a0);
  local_a1 = 0;
  local_b0 = local_30;
  local_b8._M_current =
       (SignParameter *)
       std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                 ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                  in_stack_fffffffffffffca8);
  local_c0 = (SignParameter *)
             std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                       ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                        in_stack_fffffffffffffca8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                             *)in_stack_fffffffffffffcb0,
                            (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                             *)in_stack_fffffffffffffca8), bVar1) {
    local_c8 = __gnu_cxx::
               __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
               ::operator*(&local_b8);
    in_stack_fffffffffffffcbf = SignParameter::IsOpCode(local_c8);
    if ((bool)in_stack_fffffffffffffcbf) {
      SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffca8);
      in_stack_fffffffffffffcbe = core::ScriptOperator::IsPushOperator(&local_f8);
      if ((bool)in_stack_fffffffffffffcbe) {
        local_a1 = 1;
      }
      core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x571730);
    }
    SignParameter::ConvertToSignature((SignParameter *)in_stack_fffffffffffffd68);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              (&local_a0,&local_110);
    core::ByteData::~ByteData((ByteData *)0x57176b);
    __gnu_cxx::
    __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
    ::operator++(&local_b8);
  }
  if ((local_31 & 1) == 0) {
    if ((local_a1 & 1) == 0) {
      if ((local_32 & 1) == 0) {
        TransactionController::InsertUnlockingScript
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                   in_stack_fffffffffffffe58);
      }
      else {
        TransactionController::SetUnlockingScript
                  (in_RCX,(Txid *)in_stack_fffffffffffffcc8,
                   (uint32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   CONCAT17(in_stack_fffffffffffffcbf,
                            CONCAT16(in_stack_fffffffffffffcbe,
                                     CONCAT15(in_stack_fffffffffffffcbd,
                                              CONCAT14(in_stack_fffffffffffffcbc,
                                                       in_stack_fffffffffffffcb8)))));
      }
    }
    else {
      core::Script::Script(&local_148);
      if ((local_32 & 1) == 0) {
        TransactionController::GetTxIn
                  (in_stack_fffffffffffffcc8,(Txid *)in_stack_fffffffffffffcc0,
                   CONCAT13(in_stack_fffffffffffffcbf,
                            CONCAT12(in_stack_fffffffffffffcbe,
                                     CONCAT11(in_stack_fffffffffffffcbd,in_stack_fffffffffffffcbc)))
                  );
        core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffca8);
        core::Script::operator=(&local_148,&local_180);
        core::Script::~Script((Script *)in_stack_fffffffffffffcb0);
        core::TxInReference::~TxInReference((TxInReference *)0x5718e7);
      }
      core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x571958);
      core::Script::GetElementList(&local_250,&local_148);
      local_238 = &local_250;
      local_258._M_current =
           (ScriptElement *)
           std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                     (local_238);
      local_260._M_current =
           (ScriptElement *)
           std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::end
                     (local_238);
      while (bVar1 = __gnu_cxx::operator!=(&local_258,&local_260), bVar1) {
        local_268 = __gnu_cxx::
                    __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                    ::operator*(&local_258);
        core::ScriptBuilder::AppendElement(local_230,local_268);
        __gnu_cxx::
        __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
        ::operator++(&local_258);
      }
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 in_stack_fffffffffffffcc0);
      local_270 = local_30;
      local_278._M_current =
           (SignParameter *)
           std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                     ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                      in_stack_fffffffffffffca8);
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffffca8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                 *)in_stack_fffffffffffffcb0,
                                (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                 *)in_stack_fffffffffffffca8), bVar1) {
        this = __gnu_cxx::
               __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
               ::operator*(&local_278);
        in_stack_fffffffffffffcbd = SignParameter::IsOpCode(this);
        if ((bool)in_stack_fffffffffffffcbd) {
          SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffca8);
          core::ScriptBuilder::AppendOperator(local_230,(ScriptOperator *)&stack0xfffffffffffffd48);
          core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x571b14);
        }
        else {
          SignParameter::ConvertToSignature((SignParameter *)in_stack_fffffffffffffd68);
          core::ScriptBuilder::AppendData(local_230,(ByteData *)&stack0xfffffffffffffd30);
          core::ByteData::~ByteData((ByteData *)0x571b7a);
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
        ::operator++(&local_278);
      }
      core::ScriptBuilder::Build(&local_308,local_230);
      TransactionController::SetUnlockingScript
                (in_RCX,(Txid *)in_stack_fffffffffffffcc8,
                 (uint32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                 (Script *)
                 CONCAT17(in_stack_fffffffffffffcbf,
                          CONCAT16(in_stack_fffffffffffffcbe,
                                   CONCAT15(in_stack_fffffffffffffcbd,
                                            CONCAT14(in_stack_fffffffffffffcbc,local_24)))));
      core::Script::~Script((Script *)local_20);
      core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x571c13);
      core::Script::~Script((Script *)local_20);
      in_stack_fffffffffffffcb0 = local_20;
    }
  }
  else {
    if ((local_32 & 1) != 0) {
      TransactionController::RemoveWitnessStackAll
                (in_stack_fffffffffffffcc0,
                 (Txid *)CONCAT17(in_stack_fffffffffffffcbf,
                                  CONCAT16(in_stack_fffffffffffffcbe,
                                           CONCAT15(in_stack_fffffffffffffcbd,
                                                    CONCAT14(in_stack_fffffffffffffcbc,
                                                             in_stack_fffffffffffffcb8)))),
                 (uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    }
    TransactionController::AddWitnessStack
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
               in_stack_fffffffffffffd38);
  }
  local_86 = 1;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_fffffffffffffcc0);
  if ((local_86 & 1) == 0) {
    TransactionController::~TransactionController(in_stack_fffffffffffffcb0);
  }
  return in_RDI;
}

Assistant:

T TransactionApiBase::AddSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) {
  if (hex.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddSign. Invalid hex string. empty data. tx=[{}]", hex);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  // TransactionController作成
  T txc = create_controller(hex);

  std::vector<ByteData> sign_stack;
  bool has_op_code = false;
  for (const SignParameter& sign_param : sign_params) {
    if (sign_param.IsOpCode()) {
      ScriptOperator op_code = sign_param.GetOpCode();
      if (op_code.IsPushOperator()) {
        has_op_code = true;
      }
    }
    sign_stack.push_back(sign_param.ConvertToSignature());
  }

  if (is_witness) {
    if (clear_stack) {
      txc.RemoveWitnessStackAll(txid, vout);
    }
    txc.AddWitnessStack(txid, vout, sign_stack);
  } else if (!has_op_code) {
    if (clear_stack) {
      txc.SetUnlockingScript(txid, vout, sign_stack);
    } else {
      txc.InsertUnlockingScript(txid, vout, sign_stack);
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = txc.GetTxIn(txid, vout).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    txc.SetUnlockingScript(txid, vout, builder.Build());
  }

  return txc;
}